

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void * absl::container_internal::
       Allocate<8ul,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>>
                 (allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_> *alloc,
                 size_t n)

{
  pointer pAVar1;
  long in_RSI;
  undefined1 uVar2;
  void *p;
  A my_mem_alloc;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  allocator_type *in_stack_ffffffffffffffe0;
  
  uVar2 = in_RSI != 0;
  if (!(bool)uVar2) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/container_memory.h"
                  ,0x38,
                  "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::unique_ptr<SeqEntry>>]"
                 );
  }
  std::allocator<absl::container_internal::AlignedType<8ul>>::
  allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>
            (in_stack_ffffffffffffffe0,
             (allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_> *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
  pAVar1 = std::allocator_traits<std::allocator<absl::container_internal::AlignedType<8UL>_>_>::
           allocate(in_stack_ffffffffffffffe0,
                    CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
  if (((ulong)pAVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/container_memory.h"
                  ,0x42,
                  "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::unique_ptr<SeqEntry>>]"
                 );
  }
  return pAVar1;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  void* p = AT::allocate(my_mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}